

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode Curl_connect_only_attach(Curl_easy *data)

{
  connectdata *local_28;
  connectdata *c;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  local_28 = (connectdata *)0x0;
  pCStack_18 = data;
  c._4_4_ = easy_connection(data,&local_28);
  data_local._4_4_ = c._4_4_;
  if (c._4_4_ == CURLE_OK) {
    if (pCStack_18->conn == (connectdata *)0x0) {
      Curl_attach_connection(pCStack_18,local_28);
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_connect_only_attach(struct Curl_easy *data)
{
  CURLcode result;
  struct connectdata *c = NULL;

  result = easy_connection(data, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  return CURLE_OK;
}